

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

size_t ParseDynamic(void *buf,uint offset,size_t size,uint8_t *block_id)

{
  uint8_t *puVar1;
  uint local_3c;
  uint next_size;
  DBlockIdHdr_t *dblock;
  uint8_t *block_id_local;
  size_t size_local;
  uint offset_local;
  void *buf_local;
  
  puVar1 = (uint8_t *)((long)buf + (ulong)offset);
  if (size < offset + 3) {
    fprintf(_stderr,"Inconsistency in the list of dynamic blocks at %d\n",(ulong)offset);
    buf_local = (void *)0xffffffffffffffff;
  }
  else {
    local_3c = (uint)CONCAT11(puVar1[1],puVar1[2]) << 1;
    if (CONCAT11(puVar1[1],puVar1[2]) == 0) {
      if (*puVar1 != '\0') {
        fprintf(_stderr,"Dynamic block at %d has size 0!\n",(ulong)offset);
        return 0xffffffffffffffff;
      }
      local_3c = (int)size - offset;
    }
    *block_id = *puVar1;
    buf_local = (void *)(ulong)local_3c;
  }
  return (size_t)buf_local;
}

Assistant:

size_t ParseDynamic(void *buf, unsigned int offset, size_t size, uint8_t *block_id)
{
    DBlockIdHdr_t *dblock = (DBlockIdHdr_t *)((unsigned char *)buf + offset);
    unsigned int next_size;
    if (size < offset + 3) {
        fprintf(stderr, "Inconsistency in the list of dynamic blocks at %d\n", offset);
        return -1;
    }
    next_size = (((unsigned int)(dblock->DBlockLength[0]) << 8) | (unsigned int)(dblock->DBlockLength[1])) << 1;
    if (next_size == 0) {
        if (dblock->DBlockId == EEEP_BLOCK_ID_UNUSED) {
            //  End of data
            next_size = size - offset;
        } else {
            //  Error
            fprintf(stderr, "Dynamic block at %d has size 0!\n", offset);
            return -1;
        }
    }
    *block_id = dblock->DBlockId;
    return next_size;
}